

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

bool __thiscall Json::StyledStreamWriter::isMultilineArray(StyledStreamWriter *this,Value *value)

{
  ArrayIndex AVar1;
  Value *pVVar2;
  ArrayIndex index;
  ArrayIndex index_00;
  uint uVar3;
  byte bVar4;
  bool bVar5;
  long lVar6;
  ArrayIndex index_1;
  ulong uVar7;
  bool bVar8;
  
  AVar1 = Value::size(value);
  bVar8 = this->rightMargin_ <= AVar1 * 3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->childValues_);
  index_00 = 0;
  do {
    if ((AVar1 <= index_00) || (bVar8)) {
      bVar5 = true;
      if (!bVar8) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve(&this->childValues_,(ulong)AVar1);
        this->field_0x68 = this->field_0x68 | 1;
        uVar3 = AVar1 * 2 + 2;
        lVar6 = 8;
        bVar4 = 0;
        for (uVar7 = 0; AVar1 != uVar7; uVar7 = uVar7 + 1) {
          pVVar2 = Value::operator[](value,(ArrayIndex)uVar7);
          bVar8 = hasCommentForValue(pVVar2);
          bVar4 = bVar4 | bVar8;
          pVVar2 = Value::operator[](value,(ArrayIndex)uVar7);
          writeValue(this,pVVar2);
          uVar3 = uVar3 + *(int *)((long)&(((this->childValues_).
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                          ._M_p + lVar6);
          lVar6 = lVar6 + 0x20;
        }
        this->field_0x68 = this->field_0x68 & 0xfe;
        bVar5 = (bool)(bVar4 | this->rightMargin_ <= uVar3);
      }
      return bVar5;
    }
    pVVar2 = Value::operator[](value,index_00);
    bVar8 = Value::isArray(pVVar2);
    if (bVar8) {
LAB_0066512b:
      bVar8 = Value::empty(pVVar2);
      bVar8 = !bVar8;
    }
    else {
      bVar8 = Value::isObject(pVVar2);
      if (bVar8) goto LAB_0066512b;
      bVar8 = false;
    }
    index_00 = index_00 + 1;
  } while( true );
}

Assistant:

bool StyledStreamWriter::isMultilineArray(const Value& value) {
  ArrayIndex const size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (ArrayIndex index = 0; index < size && !isMultiLine; ++index) {
    const Value& childValue = value[index];
    isMultiLine = ((childValue.isArray() || childValue.isObject()) &&
                   !childValue.empty());
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    ArrayIndex lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (ArrayIndex index = 0; index < size; ++index) {
      if (hasCommentForValue(value[index])) {
        isMultiLine = true;
      }
      writeValue(value[index]);
      lineLength += static_cast<ArrayIndex>(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}